

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udbgutil.cpp
# Opt level: O3

int32_t paramTimezoneDefault
                  (USystemParams *param_1,char *target,int32_t targetCapacity,UErrorCode *status)

{
  int32_t iVar1;
  int32_t iVar2;
  char buf2 [100];
  UChar buf [100];
  char acStack_158 [112];
  UChar local_e8 [100];
  
  iVar2 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = ucal_getDefaultTimeZone_63(local_e8,100,status);
    iVar2 = 0;
    if (0 < iVar1 && *status < U_ILLEGAL_ARGUMENT_ERROR) {
      u_UCharsToChars_63(local_e8,acStack_158,iVar1 + 1);
      iVar2 = stringToStringBuffer(target,targetCapacity,acStack_158,status);
    }
  }
  return iVar2;
}

Assistant:

U_CAPI  int32_t
paramTimezoneDefault(const USystemParams * /* param */, char *target, int32_t targetCapacity, UErrorCode *status) {
  if(U_FAILURE(*status))return 0;
  UChar buf[100];
  char buf2[100];
  int32_t len;

  len = ucal_getDefaultTimeZone(buf, 100, status);
  if(U_SUCCESS(*status)&&len>0) {
    u_UCharsToChars(buf, buf2, len+1);
    return stringToStringBuffer(target,targetCapacity, buf2,status);
  } else {
    return 0;
  }
}